

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_band.c
# Opt level: O0

int SUNMatScaleAdd_Band(realtype c,SUNMatrix A,SUNMatrix B)

{
  long lVar1;
  int iVar2;
  long lVar3;
  long *in_RSI;
  long *in_RDI;
  double in_XMM0_Qa;
  realtype *B_colj;
  realtype *A_colj;
  sunindextype j;
  sunindextype i;
  SUNMatrix in_stack_ffffffffffffffc8;
  undefined4 local_28;
  undefined4 local_24;
  undefined4 local_4;
  
  iVar2 = SMCompatible_Band(in_stack_ffffffffffffffc8,(SUNMatrix)0x1170ed3);
  if (iVar2 == 0) {
    local_4 = -0x2bd;
  }
  else if ((*(int *)(*in_RDI + 0xc) < *(int *)(*in_RSI + 0xc)) ||
          (*(int *)(*in_RDI + 0x10) < *(int *)(*in_RSI + 0x10))) {
    local_4 = SMScaleAddNew_Band((realtype)A,B,_j);
  }
  else {
    for (local_28 = 0; local_28 < *(int *)(*in_RDI + 4); local_28 = local_28 + 1) {
      lVar3 = *(long *)(*(long *)(*in_RDI + 0x28) + (long)local_28 * 8) +
              (long)*(int *)(*in_RDI + 0x14) * 8;
      lVar1 = *(long *)(*(long *)(*in_RSI + 0x28) + (long)local_28 * 8);
      iVar2 = *(int *)(*in_RSI + 0x14);
      for (local_24 = -*(int *)(*in_RSI + 0xc); local_24 <= *(int *)(*in_RSI + 0x10);
          local_24 = local_24 + 1) {
        *(double *)(lVar3 + (long)local_24 * 8) =
             in_XMM0_Qa * *(double *)(lVar3 + (long)local_24 * 8) +
             *(double *)(lVar1 + (long)iVar2 * 8 + (long)local_24 * 8);
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int SUNMatScaleAdd_Band(realtype c, SUNMatrix A, SUNMatrix B)
{
  sunindextype i, j;
  realtype *A_colj, *B_colj;

  /* Verify that A and B are compatible */
  if (!SMCompatible_Band(A, B))
    return SUNMAT_ILL_INPUT;

  /* Call separate routine in B has larger bandwidth(s) than A */
  if ( (SM_UBAND_B(B) > SM_UBAND_B(A)) ||
       (SM_LBAND_B(B) > SM_LBAND_B(A)) ) {
    return SMScaleAddNew_Band(c,A,B);
  }

  /* Otherwise, perform operation in-place */
  for (j=0; j<SM_COLUMNS_B(A); j++) {
    A_colj = SM_COLUMN_B(A,j);
    B_colj = SM_COLUMN_B(B,j);
    for (i=-SM_UBAND_B(B); i<=SM_LBAND_B(B); i++)
      A_colj[i] = c*A_colj[i] + B_colj[i];
  }
  return SUNMAT_SUCCESS;
}